

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bdecode.cpp
# Opt level: O1

bdecode_node * __thiscall
libtorrent::bdecode(bdecode_node *__return_storage_ptr__,libtorrent *this,span<const_char> buffer,
                   error_code *ec,int *error_pos,int depth_limit,int token_limit)

{
  byte bVar1;
  _func_int *p_Var2;
  pointer pbVar3;
  pointer pbVar4;
  long lVar5;
  int *piVar6;
  vector<libtorrent::detail::bdecode_token,_std::allocator<libtorrent::detail::bdecode_token>_>
  *pvVar7;
  error_code *peVar8;
  char cVar9;
  int iVar10;
  uint uVar11;
  int iVar12;
  int iVar13;
  uint uVar14;
  ulong uVar15;
  ulong uVar16;
  int iVar17;
  ulong *puVar18;
  ulong uVar19;
  ulong uVar20;
  char *pcVar21;
  error_code *peVar22;
  void *pvVar23;
  libtorrent *plVar24;
  error_code *peVar25;
  uint uVar26;
  error_code *peVar27;
  uint uVar28;
  long lVar29;
  bool bVar30;
  undefined8 uStack_90;
  bdecode_token local_88;
  ulong local_80;
  libtorrent *local_78;
  error_code *local_70;
  ulong local_68;
  bdecode_token local_60;
  ulong *local_58;
  error_code *local_50;
  void *local_48;
  error_code *local_40;
  uint local_38;
  int local_34;
  
  puVar18 = (ulong *)buffer.m_len;
  pcVar21 = buffer.m_ptr;
  *(undefined1 (*) [16])((long)&__return_storage_ptr__->m_root_tokens + 4) = (undefined1  [16])0x0;
  *(undefined1 (*) [16])
   &(__return_storage_ptr__->m_tokens).
    super_vector<libtorrent::detail::bdecode_token,_std::allocator<libtorrent::detail::bdecode_token>_>
    .
    super__Vector_base<libtorrent::detail::bdecode_token,_std::allocator<libtorrent::detail::bdecode_token>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (undefined1  [16])0x0;
  pvVar7 = &(__return_storage_ptr__->m_tokens).
            super_vector<libtorrent::detail::bdecode_token,_std::allocator<libtorrent::detail::bdecode_token>_>
  ;
  (pvVar7->
  super__Vector_base<libtorrent::detail::bdecode_token,_std::allocator<libtorrent::detail::bdecode_token>_>
  )._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (pvVar7->
  super__Vector_base<libtorrent::detail::bdecode_token,_std::allocator<libtorrent::detail::bdecode_token>_>
  )._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  __return_storage_ptr__->m_token_idx = -1;
  __return_storage_ptr__->m_last_index = -1;
  __return_storage_ptr__->m_last_token = -1;
  __return_storage_ptr__->m_size = -1;
  *(undefined4 *)puVar18 = 0;
  *(undefined1 *)((long)puVar18 + 4) = 0;
  puVar18[1] = (ulong)&boost::system::detail::cat_holder<void>::system_category_instance;
  if ((long)pcVar21 < 0x20000000) {
    uVar28 = (uint)error_pos;
    uVar15 = (ulong)error_pos & 0xffffffff;
    local_58 = puVar18;
    lVar5 = -((long)(int)uVar28 * 4 + 0xfU & 0xfffffffffffffff0);
    local_48 = (void *)((long)&local_88 + lVar5);
    local_38 = uVar28;
    if (uVar28 != 0) {
      *(undefined8 *)((long)&uStack_90 + lVar5) = 0x18e4bf;
      memset((void *)((long)&local_88 + lVar5),0,(long)(int)uVar28 << 2);
      uVar15 = (ulong)local_38;
    }
    local_88 = (bdecode_token)0x1a0000000;
    local_78 = this;
    if (pcVar21 == (char *)0x0) {
      uVar15 = 0x100000003;
      if ((bdecode_category::bdecode_category.super_error_category.id_ != 0x8fafd21e25c5e09b) &&
         (uVar15 = 0x100000003,
         bdecode_category::bdecode_category.super_error_category.id_ != 0xb2ab117a257edf0d)) {
        p_Var2 = bdecode_category::bdecode_category.super_error_category._vptr_error_category[6];
        *(undefined8 *)((long)&uStack_90 + lVar5) = 0x18f209;
        iVar10 = (*p_Var2)(&bdecode_category::bdecode_category,3);
        uVar15 = 3;
        if ((char)iVar10 != '\0') {
          uVar15 = 0x100000003;
        }
      }
      *local_58 = uVar15;
      local_58[1] = (ulong)&bdecode_category::bdecode_category;
      uVar28 = 0;
      pvVar23 = local_48;
      if (ec != (error_code *)0x0) {
        ec->val_ = 0;
      }
    }
    else {
      peVar25 = (error_code *)(pcVar21 + (long)this);
      local_80 = 0x100000001;
      uVar28 = 0;
      local_50 = peVar25;
      pvVar23 = local_48;
      plVar24 = this;
      do {
        peVar27 = local_40;
        puVar18 = local_58;
        iVar10 = (int)plVar24;
        uVar20 = 0x100000003;
        uVar16 = (ulong)uVar28;
        if (peVar25 < this) goto LAB_0018f400;
        iVar12 = (int)this;
        if (peVar25 <= this) {
          uVar15 = 0x100000003;
          if ((bdecode_category::bdecode_category.super_error_category.id_ != 0x8fafd21e25c5e09b) &&
             (uVar15 = 0x100000003,
             bdecode_category::bdecode_category.super_error_category.id_ != 0xb2ab117a257edf0d)) {
            p_Var2 = bdecode_category::bdecode_category.super_error_category._vptr_error_category[6]
            ;
            *(undefined8 *)((long)&uStack_90 + lVar5) = 0x18f2ca;
            iVar13 = (*p_Var2)(&bdecode_category::bdecode_category,3);
            bVar30 = (char)iVar13 == '\0';
            uVar15 = 3;
            uVar20 = 0x100000003;
LAB_0018f3da:
            pvVar23 = local_48;
            if (!bVar30) {
              uVar15 = uVar20;
            }
          }
LAB_0018f3de:
          *local_58 = uVar15;
          local_58[1] = (ulong)&bdecode_category::bdecode_category;
          if (ec != (error_code *)0x0) {
            ec->val_ = iVar12 - iVar10;
          }
          goto LAB_0018f400;
        }
        if ((int)uVar15 <= (int)uVar28) {
          uVar15 = 0x100000005;
          if ((bdecode_category::bdecode_category.super_error_category.id_ != 0x8fafd21e25c5e09b) &&
             (bdecode_category::bdecode_category.super_error_category.id_ != 0xb2ab117a257edf0d)) {
            p_Var2 = bdecode_category::bdecode_category.super_error_category._vptr_error_category[6]
            ;
            *(undefined8 *)((long)&uStack_90 + lVar5) = 0x18f343;
            iVar13 = (*p_Var2)(&bdecode_category::bdecode_category,5);
            uVar20 = 0x100000005;
            bVar30 = (char)iVar13 == '\0';
            uVar15 = 5;
            goto LAB_0018f3da;
          }
          goto LAB_0018f3de;
        }
        if (depth_limit < 1) {
          uVar15 = 0x100000006;
          if ((bdecode_category::bdecode_category.super_error_category.id_ != 0x8fafd21e25c5e09b) &&
             (uVar15 = 0x100000006,
             bdecode_category::bdecode_category.super_error_category.id_ != 0xb2ab117a257edf0d)) {
            p_Var2 = bdecode_category::bdecode_category.super_error_category._vptr_error_category[6]
            ;
            *(undefined8 *)((long)&uStack_90 + lVar5) = 0x18f3b5;
            iVar13 = (*p_Var2)(&bdecode_category::bdecode_category,6);
            uVar20 = 0x100000006;
            bVar30 = (char)iVar13 == '\0';
            uVar15 = 6;
            goto LAB_0018f3da;
          }
          goto LAB_0018f3de;
        }
        cVar9 = (char)((error_code *)this)->val_;
        uVar14 = uVar28;
        if ((((0 < (int)uVar28) &&
             (uVar26 = *(uint *)((long)pvVar23 + (ulong)uVar28 * 4 + -4), -1 < (int)uVar26)) &&
            ((SUB84((__return_storage_ptr__->m_tokens).
                    super_vector<libtorrent::detail::bdecode_token,_std::allocator<libtorrent::detail::bdecode_token>_>
                    .
                    super__Vector_base<libtorrent::detail::bdecode_token,_std::allocator<libtorrent::detail::bdecode_token>_>
                    ._M_impl.super__Vector_impl_data._M_start[uVar26 & 0x7fffffff],0) & 0xe0000000)
             == 0x20000000)) && (cVar9 != 'e' && 9 < (byte)(cVar9 - 0x30U))) {
          uVar20 = local_80;
          if ((bdecode_category::bdecode_category.super_error_category.id_ != 0x8fafd21e25c5e09b) &&
             (bdecode_category::bdecode_category.super_error_category.id_ != 0xb2ab117a257edf0d)) {
            p_Var2 = bdecode_category::bdecode_category.super_error_category._vptr_error_category[6]
            ;
            local_40 = (error_code *)this;
            *(undefined8 *)((long)&uStack_90 + lVar5) = 0x18e8f4;
            iVar12 = (*p_Var2)(&bdecode_category::bdecode_category,1);
            uVar15 = (ulong)local_38;
            uVar20 = 1;
            this = (libtorrent *)local_40;
            pvVar23 = local_48;
            peVar25 = local_50;
            if ((char)iVar12 != '\0') {
              uVar20 = local_80;
            }
          }
          *local_58 = uVar20;
          local_58[1] = (ulong)&bdecode_category::bdecode_category;
LAB_0018e9d6:
          iVar13 = 4;
          if (ec != (error_code *)0x0) {
            ec->val_ = (int)this - iVar10;
          }
          goto LAB_0018f12e;
        }
        switch(cVar9) {
        case 'd':
          local_34 = depth_limit;
          *(uint *)((long)pvVar23 + (long)(int)uVar28 * 4) =
               (uint)((ulong)((long)(__return_storage_ptr__->m_tokens).
                                    super_vector<libtorrent::detail::bdecode_token,_std::allocator<libtorrent::detail::bdecode_token>_>
                                    .
                                    super__Vector_base<libtorrent::detail::bdecode_token,_std::allocator<libtorrent::detail::bdecode_token>_>
                                    ._M_impl.super__Vector_impl_data._M_finish -
                             (long)(__return_storage_ptr__->m_tokens).
                                   super_vector<libtorrent::detail::bdecode_token,_std::allocator<libtorrent::detail::bdecode_token>_>
                                   .
                                   super__Vector_base<libtorrent::detail::bdecode_token,_std::allocator<libtorrent::detail::bdecode_token>_>
                                   ._M_impl.super__Vector_impl_data._M_start) >> 3) & 0x7fffffff;
          local_60 = (bdecode_token)((ulong)(iVar12 - iVar10 & 0x1fffffff) | 0x20000000);
          *(undefined8 *)((long)&uStack_90 + lVar5) = 0x18e5e2;
          std::
          vector<libtorrent::detail::bdecode_token,_std::allocator<libtorrent::detail::bdecode_token>_>
          ::emplace_back<libtorrent::detail::bdecode_token>
                    ((vector<libtorrent::detail::bdecode_token,_std::allocator<libtorrent::detail::bdecode_token>_>
                      *)__return_storage_ptr__,&local_60);
          goto LAB_0018e77f;
        case 'e':
          if (uVar28 == 0) {
            if ((bdecode_category::bdecode_category.super_error_category.id_ != 0x8fafd21e25c5e09b)
               && (uVar20 = 0x100000003,
                  bdecode_category::bdecode_category.super_error_category.id_ != 0xb2ab117a257edf0d)
               ) {
              p_Var2 = bdecode_category::bdecode_category.super_error_category._vptr_error_category
                       [6];
              local_40 = (error_code *)this;
              *(undefined8 *)((long)&uStack_90 + lVar5) = 0x18ea3f;
              iVar12 = (*p_Var2)(&bdecode_category::bdecode_category,3);
              uVar15 = (ulong)local_38;
              uVar20 = 3;
              this = (libtorrent *)local_40;
              pvVar23 = local_48;
              peVar25 = local_50;
              if ((char)iVar12 != '\0') {
                uVar20 = 0x100000003;
              }
            }
            *local_58 = uVar20;
            local_58[1] = (ulong)&bdecode_category::bdecode_category;
            iVar13 = 4;
            uVar14 = 0;
            if (ec != (error_code *)0x0) {
              ec->val_ = (int)this - iVar10;
            }
          }
          else {
            if (((0 < (int)uVar28) &&
                (uVar26 = *(uint *)((long)pvVar23 + (ulong)uVar28 * 4 + -4), (int)uVar26 < 0)) &&
               ((SUB84((__return_storage_ptr__->m_tokens).
                       super_vector<libtorrent::detail::bdecode_token,_std::allocator<libtorrent::detail::bdecode_token>_>
                       .
                       super__Vector_base<libtorrent::detail::bdecode_token,_std::allocator<libtorrent::detail::bdecode_token>_>
                       ._M_impl.super__Vector_impl_data._M_start[uVar26 & 0x7fffffff],0) &
                0xe0000000) == 0x20000000)) goto LAB_0018e940;
            local_60 = (bdecode_token)((ulong)(iVar12 - iVar10 & 0x1fffffff) | 0x1a0000000);
            local_40 = ec;
            local_34 = depth_limit;
            *(undefined8 *)((long)&uStack_90 + lVar5) = 0x18e6bd;
            std::
            vector<libtorrent::detail::bdecode_token,_std::allocator<libtorrent::detail::bdecode_token>_>
            ::emplace_back<libtorrent::detail::bdecode_token>
                      ((vector<libtorrent::detail::bdecode_token,_std::allocator<libtorrent::detail::bdecode_token>_>
                        *)__return_storage_ptr__,&local_60);
            uVar26 = *(uint *)((long)local_48 + (long)(int)uVar28 * 4 + -4);
            uVar11 = uVar26 & 0x7fffffff;
            pbVar3 = (__return_storage_ptr__->m_tokens).
                     super_vector<libtorrent::detail::bdecode_token,_std::allocator<libtorrent::detail::bdecode_token>_>
                     .
                     super__Vector_base<libtorrent::detail::bdecode_token,_std::allocator<libtorrent::detail::bdecode_token>_>
                     ._M_impl.super__Vector_impl_data._M_start;
            iVar13 = (int)((ulong)((long)(__return_storage_ptr__->m_tokens).
                                         super_vector<libtorrent::detail::bdecode_token,_std::allocator<libtorrent::detail::bdecode_token>_>
                                         .
                                         super__Vector_base<libtorrent::detail::bdecode_token,_std::allocator<libtorrent::detail::bdecode_token>_>
                                         ._M_impl.super__Vector_impl_data._M_finish - (long)pbVar3)
                          >> 3);
            iVar17 = iVar13 - uVar11;
            if (iVar17 < 0x20000000) {
              pbVar3[uVar11] =
                   (bdecode_token)
                   ((ulong)pbVar3[uVar11] & 0xe0000000ffffffff |
                   (ulong)(iVar13 - uVar26 & 0x1fffffff) << 0x20);
              this = (libtorrent *)((long)&((error_code *)this)->val_ + 1);
              iVar13 = 0xf;
              uVar14 = uVar28 - 1;
            }
            else {
              uVar15 = 0x100000006;
              if ((bdecode_category::bdecode_category.super_error_category.id_ != 0x8fafd21e25c5e09b
                  ) && (bdecode_category::bdecode_category.super_error_category.id_ !=
                        0xb2ab117a257edf0d)) {
                p_Var2 = bdecode_category::bdecode_category.super_error_category.
                         _vptr_error_category[6];
                *(undefined8 *)((long)&uStack_90 + lVar5) = 0x18eb93;
                iVar13 = (*p_Var2)(&bdecode_category::bdecode_category,6);
                uVar15 = 0x100000006;
                if ((char)iVar13 == '\0') {
                  uVar15 = 6;
                }
              }
              *local_58 = uVar15;
              local_58[1] = (ulong)&bdecode_category::bdecode_category;
              iVar13 = 4;
              if (local_40 != (error_code *)0x0) {
                local_40->val_ = iVar12 - iVar10;
              }
            }
            uVar15 = (ulong)local_38;
            pvVar23 = local_48;
            ec = local_40;
            plVar24 = local_78;
            peVar25 = local_50;
            depth_limit = local_34;
            if (iVar17 < 0x20000000) goto LAB_0018e7ac;
          }
          break;
        default:
          if (9 < (byte)(cVar9 - 0x30U)) {
LAB_0018e940:
            uVar20 = 0x100000004;
            if ((bdecode_category::bdecode_category.super_error_category.id_ != 0x8fafd21e25c5e09b)
               && (bdecode_category::bdecode_category.super_error_category.id_ != 0xb2ab117a257edf0d
                  )) {
              p_Var2 = bdecode_category::bdecode_category.super_error_category._vptr_error_category
                       [6];
              local_40 = (error_code *)this;
              *(undefined8 *)((long)&uStack_90 + lVar5) = 0x18e98f;
              iVar12 = (*p_Var2)(&bdecode_category::bdecode_category,4);
              uVar15 = (ulong)local_38;
              uVar20 = 0x100000004;
              this = (libtorrent *)local_40;
              pvVar23 = local_48;
              peVar25 = local_50;
              if ((char)iVar12 == '\0') {
                uVar20 = 4;
              }
            }
            *local_58 = uVar20;
            local_58[1] = (ulong)&bdecode_category::bdecode_category;
            goto LAB_0018e9d6;
          }
          local_34 = depth_limit;
          peVar22 = (error_code *)((long)&((error_code *)this)->val_ + 1);
          if (peVar22 < peVar25) {
            uVar20 = (ulong)(byte)(cVar9 - 0x30);
            local_40 = (error_code *)((ulong)local_40 & 0xffffffff00000000);
            peVar8 = local_40;
            for (; local_40 = peVar8, peVar22 < peVar25;
                peVar22 = (error_code *)((long)&peVar22->val_ + 1)) {
              bVar1 = (byte)peVar22->val_;
              uVar19 = (ulong)bVar1;
              if (uVar19 == 0x3a) break;
              local_40._4_4_ = SUB84(peVar27,4);
              if (9 < (byte)(bVar1 - 0x30)) {
                local_40 = (error_code *)CONCAT44(local_40._4_4_,1);
                break;
              }
              if (0xccccccccccccccc < (long)uVar20) {
                local_40 = (error_code *)CONCAT44(local_40._4_4_,7);
                break;
              }
              uVar20 = uVar20 * 10;
              if ((long)(-0x7fffffffffffffd1 - uVar19) < (long)uVar20) {
                local_40 = (error_code *)CONCAT44(local_40._4_4_,7);
                break;
              }
              uVar20 = (uVar20 + uVar19) - 0x30;
            }
            if ((int)local_40 == 0) {
              if (peVar22 == peVar25) {
                local_70 = peVar22;
                uVar20 = 0x100000002;
                if ((bdecode_category::bdecode_category.super_error_category.id_ !=
                     0x8fafd21e25c5e09b) &&
                   (bdecode_category::bdecode_category.super_error_category.id_ !=
                    0xb2ab117a257edf0d)) {
                  p_Var2 = bdecode_category::bdecode_category.super_error_category.
                           _vptr_error_category[6];
                  *(undefined8 *)((long)&uStack_90 + lVar5) = 0x18ef94;
                  iVar12 = (*p_Var2)(&bdecode_category::bdecode_category,2);
                  uVar20 = 0x100000002;
                  cVar9 = (char)iVar12;
                  uVar16 = 2;
                  peVar22 = local_70;
LAB_0018f0f6:
                  uVar15 = (ulong)local_38;
                  pvVar23 = local_48;
                  peVar25 = local_50;
                  if (cVar9 == '\0') {
                    uVar20 = uVar16;
                  }
                }
LAB_0018f0fa:
                *local_58 = uVar20;
                local_58[1] = (ulong)&bdecode_category::bdecode_category;
                if (ec != (error_code *)0x0) goto LAB_0018f116;
                goto LAB_0018f11e;
              }
              if ((long)((long)&peVar25->val_ + ~(ulong)peVar22) < (long)uVar20) {
                uVar20 = 0x100000003;
                if ((bdecode_category::bdecode_category.super_error_category.id_ !=
                     0x8fafd21e25c5e09b) &&
                   (uVar20 = 0x100000003,
                   bdecode_category::bdecode_category.super_error_category.id_ != 0xb2ab117a257edf0d
                   )) {
                  p_Var2 = bdecode_category::bdecode_category.super_error_category.
                           _vptr_error_category[6];
                  local_68 = uVar16;
                  *(undefined8 *)((long)&uStack_90 + lVar5) = 0x18eea2;
                  iVar12 = (*p_Var2)(&bdecode_category::bdecode_category,3);
                  uVar28 = (uint)local_68;
                  uVar15 = (ulong)local_38;
                  uVar20 = 3;
                  pvVar23 = local_48;
                  peVar25 = local_50;
                  if ((char)iVar12 != '\0') {
                    uVar20 = 0x100000003;
                  }
                }
                *local_58 = uVar20;
                local_58[1] = (ulong)&bdecode_category::bdecode_category;
                iVar13 = 4;
                if (ec != (error_code *)0x0) {
                  ec->val_ = (int)peVar22 - iVar10;
                }
                bVar30 = false;
                depth_limit = local_34;
                uVar14 = uVar28;
              }
              else {
                if ((long)uVar20 < 0) {
                  uVar20 = 0x100000007;
                  if ((bdecode_category::bdecode_category.super_error_category.id_ !=
                       0x8fafd21e25c5e09b) &&
                     (uVar20 = 0x100000007,
                     bdecode_category::bdecode_category.super_error_category.id_ !=
                     0xb2ab117a257edf0d)) {
                    p_Var2 = bdecode_category::bdecode_category.super_error_category.
                             _vptr_error_category[6];
                    local_68 = uVar16;
                    *(undefined8 *)((long)&uStack_90 + lVar5) = 0x18f0ce;
                    iVar12 = (*p_Var2)(&bdecode_category::bdecode_category,7);
                    uVar28 = (uint)local_68;
                    uVar20 = 0x100000007;
                    cVar9 = (char)iVar12;
                    uVar16 = 7;
                    goto LAB_0018f0f6;
                  }
                  goto LAB_0018f0fa;
                }
                local_70 = (error_code *)((long)&peVar22->val_ + 1);
                lVar29 = (long)local_70 - (long)this;
                if (9 < lVar29) {
                  uVar20 = 0x100000006;
                  if ((bdecode_category::bdecode_category.super_error_category.id_ !=
                       0x8fafd21e25c5e09b) &&
                     (uVar20 = 0x100000006,
                     bdecode_category::bdecode_category.super_error_category.id_ !=
                     0xb2ab117a257edf0d)) {
                    p_Var2 = bdecode_category::bdecode_category.super_error_category.
                             _vptr_error_category[6];
                    local_68 = uVar16;
                    *(undefined8 *)((long)&uStack_90 + lVar5) = 0x18f03d;
                    iVar12 = (*p_Var2)(&bdecode_category::bdecode_category,6);
                    uVar28 = (uint)local_68;
                    uVar15 = (ulong)local_38;
                    uVar20 = 0x100000006;
                    pvVar23 = local_48;
                    peVar25 = local_50;
                    if ((char)iVar12 == '\0') {
                      uVar20 = 6;
                    }
                  }
                  *puVar18 = uVar20;
                  goto LAB_0018ef08;
                }
                local_60 = (bdecode_token)
                           ((lVar29 << 0x3d | (ulong)(iVar12 - iVar10 & 0x1fffffff) | 0x1a0000000) +
                           0xbfffffffc0000000);
                local_68 = uVar16;
                local_40 = ec;
                *(undefined8 *)((long)&uStack_90 + lVar5) = 0x18f183;
                std::
                vector<libtorrent::detail::bdecode_token,_std::allocator<libtorrent::detail::bdecode_token>_>
                ::emplace_back<libtorrent::detail::bdecode_token>
                          ((vector<libtorrent::detail::bdecode_token,_std::allocator<libtorrent::detail::bdecode_token>_>
                            *)__return_storage_ptr__,&local_60);
                peVar22 = (error_code *)((long)&local_70->val_ + uVar20);
                iVar13 = 0xf;
                bVar30 = true;
                uVar15 = (ulong)local_38;
                pvVar23 = local_48;
                ec = local_40;
                peVar25 = local_50;
                uVar14 = (uint)local_68;
              }
            }
            else {
              local_70 = peVar22;
              uVar20 = 0x100000000;
              if ((bdecode_category::bdecode_category.super_error_category.id_ != 0x8fafd21e25c5e09b
                  ) && (uVar20 = 0x100000000,
                       bdecode_category::bdecode_category.super_error_category.id_ !=
                       0xb2ab117a257edf0d)) {
                uVar15 = (ulong)local_40 & 0xffffffff;
                p_Var2 = bdecode_category::bdecode_category.super_error_category.
                         _vptr_error_category[6];
                local_68 = uVar16;
                *(undefined8 *)((long)&uStack_90 + lVar5) = 0x18edf3;
                iVar12 = (*p_Var2)(&bdecode_category::bdecode_category,uVar15);
                uVar28 = (uint)local_68;
                uVar15 = (ulong)local_38;
                uVar20 = 0x100000000;
                pvVar23 = local_48;
                peVar25 = local_50;
                if ((char)iVar12 == '\0') {
                  uVar20 = 0;
                }
              }
              *puVar18 = (ulong)local_40 & 0xffffffff | uVar20;
LAB_0018ef08:
              puVar18[1] = (ulong)&bdecode_category::bdecode_category;
              iVar13 = 4;
              peVar22 = local_70;
              if (ec == (error_code *)0x0) {
                bVar30 = false;
                depth_limit = local_34;
                uVar14 = uVar28;
              }
              else {
LAB_0018f116:
                ec->val_ = (int)peVar22 - iVar10;
LAB_0018f11e:
                iVar13 = 4;
                bVar30 = false;
                depth_limit = local_34;
                uVar14 = uVar28;
              }
            }
          }
          else {
            uVar20 = 0x100000003;
            if ((bdecode_category::bdecode_category.super_error_category.id_ != 0x8fafd21e25c5e09b)
               && (uVar20 = 0x100000003,
                  bdecode_category::bdecode_category.super_error_category.id_ != 0xb2ab117a257edf0d)
               ) {
              p_Var2 = bdecode_category::bdecode_category.super_error_category._vptr_error_category
                       [6];
              *(undefined8 *)((long)&uStack_90 + lVar5) = 0x18eae3;
              iVar10 = (*p_Var2)(&bdecode_category::bdecode_category,3);
              uVar15 = (ulong)local_38;
              uVar20 = 3;
              pvVar23 = local_48;
              plVar24 = local_78;
              peVar25 = local_50;
              if ((char)iVar10 != '\0') {
                uVar20 = 0x100000003;
              }
            }
            *local_58 = uVar20;
            local_58[1] = (ulong)&bdecode_category::bdecode_category;
            iVar13 = 4;
            if (ec != (error_code *)0x0) {
              ec->val_ = (int)peVar22 - (int)plVar24;
            }
            bVar30 = false;
            depth_limit = local_34;
          }
          this = (libtorrent *)peVar22;
          uVar28 = uVar14;
          if (bVar30) goto LAB_0018e7ac;
          break;
        case 'i':
          local_34 = depth_limit;
          peVar27 = (error_code *)((long)&((error_code *)this)->val_ + 1);
          uVar26 = 3;
          if ((peVar27 != peVar25) &&
             (((char)peVar27->val_ != '-' ||
              (peVar27 = (error_code *)((long)&((error_code *)this)->val_ + 2), peVar27 != peVar25))
             )) {
            iVar13 = (int)peVar25 - (int)peVar27;
            iVar17 = 0;
            peVar27 = (error_code *)((long)&peVar27->val_ + 1);
            do {
              if (9 < (byte)(*(char *)((long)&peVar27[-1].cat_ + 7) - 0x30U)) {
                uVar26 = 1;
                iVar13 = iVar17;
                goto LAB_0018ebcc;
              }
              if (peVar27 == peVar25) {
                uVar26 = 3;
                peVar27 = peVar25;
                goto LAB_0018ebd9;
              }
              iVar17 = iVar17 + 1;
              peVar22 = (error_code *)((long)&peVar27->val_ + 1);
              piVar6 = &peVar27->val_;
              peVar27 = peVar22;
            } while ((char)*piVar6 != 'e');
            uVar26 = 0;
            iVar13 = iVar17;
LAB_0018ebcc:
            peVar27 = (error_code *)((long)&peVar27[-1].cat_ + 7);
LAB_0018ebd9:
            if (0x14 < iVar13) {
              uVar26 = 7;
            }
          }
          if (uVar26 == 0) {
            local_60 = (bdecode_token)((ulong)(iVar12 - iVar10 & 0x1fffffff) + 0x180000000);
            local_68 = uVar16;
            *(undefined8 *)((long)&uStack_90 + lVar5) = 0x18ecb6;
            std::
            vector<libtorrent::detail::bdecode_token,_std::allocator<libtorrent::detail::bdecode_token>_>
            ::emplace_back<libtorrent::detail::bdecode_token>
                      ((vector<libtorrent::detail::bdecode_token,_std::allocator<libtorrent::detail::bdecode_token>_>
                        *)__return_storage_ptr__,&local_60);
            this = (libtorrent *)((long)&peVar27->val_ + 1);
            iVar13 = 0xf;
            uVar15 = (ulong)local_38;
            uVar14 = (uint)local_68;
            pvVar23 = local_48;
            plVar24 = local_78;
            peVar25 = local_50;
          }
          else {
            if (ec != (error_code *)0x0) {
              ec->val_ = (int)peVar27 - iVar10;
            }
            uVar20 = 0x100000000;
            if ((bdecode_category::bdecode_category.super_error_category.id_ != 0x8fafd21e25c5e09b)
               && (uVar20 = 0x100000000,
                  bdecode_category::bdecode_category.super_error_category.id_ != 0xb2ab117a257edf0d)
               ) {
              p_Var2 = bdecode_category::bdecode_category.super_error_category._vptr_error_category
                       [6];
              local_68 = uVar16;
              local_40 = (error_code *)this;
              *(undefined8 *)((long)&uStack_90 + lVar5) = 0x18ec5a;
              iVar10 = (*p_Var2)(&bdecode_category::bdecode_category,(ulong)uVar26);
              uVar14 = (uint)local_68;
              uVar20 = 0x100000000;
              this = (libtorrent *)local_40;
              pvVar23 = local_48;
              peVar25 = local_50;
              if ((char)iVar10 == '\0') {
                uVar20 = 0;
              }
            }
            *local_58 = uVar26 | uVar20;
            local_58[1] = (ulong)&bdecode_category::bdecode_category;
            iVar13 = 4;
            ec = (error_code *)0x0;
          }
          depth_limit = local_34;
          uVar28 = uVar14;
          if (uVar26 != 0) break;
          goto LAB_0018e7ac;
        case 'l':
          local_34 = depth_limit;
          *(uint *)((long)pvVar23 + (long)(int)uVar28 * 4) =
               (uint)((ulong)((long)(__return_storage_ptr__->m_tokens).
                                    super_vector<libtorrent::detail::bdecode_token,_std::allocator<libtorrent::detail::bdecode_token>_>
                                    .
                                    super__Vector_base<libtorrent::detail::bdecode_token,_std::allocator<libtorrent::detail::bdecode_token>_>
                                    ._M_impl.super__Vector_impl_data._M_finish -
                             (long)(__return_storage_ptr__->m_tokens).
                                   super_vector<libtorrent::detail::bdecode_token,_std::allocator<libtorrent::detail::bdecode_token>_>
                                   .
                                   super__Vector_base<libtorrent::detail::bdecode_token,_std::allocator<libtorrent::detail::bdecode_token>_>
                                   ._M_impl.super__Vector_impl_data._M_start) >> 3) & 0x7fffffff;
          local_60 = (bdecode_token)((ulong)(iVar12 - iVar10 & 0x1fffffff) | 0x40000000);
          *(undefined8 *)((long)&uStack_90 + lVar5) = 0x18e77f;
          std::
          vector<libtorrent::detail::bdecode_token,_std::allocator<libtorrent::detail::bdecode_token>_>
          ::emplace_back<libtorrent::detail::bdecode_token>
                    ((vector<libtorrent::detail::bdecode_token,_std::allocator<libtorrent::detail::bdecode_token>_>
                      *)__return_storage_ptr__,&local_60);
LAB_0018e77f:
          uVar14 = uVar28 + 1;
          this = (libtorrent *)((long)&((error_code *)this)->val_ + 1);
          uVar15 = (ulong)local_38;
          pvVar23 = local_48;
          peVar25 = local_50;
          depth_limit = local_34;
LAB_0018e7ac:
          if (0 < (int)uVar28) {
            uVar26 = *(uint *)((long)pvVar23 + (ulong)uVar28 * 4 + -4);
            if (((ulong)(__return_storage_ptr__->m_tokens).
                        super_vector<libtorrent::detail::bdecode_token,_std::allocator<libtorrent::detail::bdecode_token>_>
                        .
                        super__Vector_base<libtorrent::detail::bdecode_token,_std::allocator<libtorrent::detail::bdecode_token>_>
                        ._M_impl.super__Vector_impl_data._M_start[uVar26 & 0x7fffffff] & 0xe0000000)
                == 0x20000000) {
              *(uint *)((long)pvVar23 + (ulong)uVar28 * 4 + -4) = uVar26 + 0x80000000;
            }
          }
          iVar13 = 0;
          if (uVar14 == 0) {
            iVar13 = 6;
          }
        }
LAB_0018f12e:
        uVar28 = uVar14;
        depth_limit = depth_limit + -1;
      } while (iVar13 == 0);
      if ((iVar13 != 6) && (iVar13 != 4)) {
        pbVar3 = (__return_storage_ptr__->m_tokens).
                 super_vector<libtorrent::detail::bdecode_token,_std::allocator<libtorrent::detail::bdecode_token>_>
                 .
                 super__Vector_base<libtorrent::detail::bdecode_token,_std::allocator<libtorrent::detail::bdecode_token>_>
                 ._M_impl.super__Vector_impl_data._M_start;
        if (pbVar3 == (pointer)0x0) {
          return __return_storage_ptr__;
        }
        pbVar4 = (__return_storage_ptr__->m_tokens).
                 super_vector<libtorrent::detail::bdecode_token,_std::allocator<libtorrent::detail::bdecode_token>_>
                 .
                 super__Vector_base<libtorrent::detail::bdecode_token,_std::allocator<libtorrent::detail::bdecode_token>_>
                 ._M_impl.super__Vector_impl_data._M_end_of_storage;
        *(undefined8 *)((long)&uStack_90 + lVar5) = 0x18f270;
        operator_delete(pbVar3,(long)pbVar4 - (long)pbVar3);
        return __return_storage_ptr__;
      }
    }
LAB_0018f400:
    local_40 = (error_code *)this;
    if (0 < (int)uVar28) {
      uVar15 = (ulong)((int)this - (int)local_78 & 0x1fffffff);
      local_88 = (bdecode_token)((long)local_88 + uVar15);
      lVar29 = (ulong)uVar28 + 1;
      do {
        uVar28 = *(uint *)((long)pvVar23 + lVar29 * 4 + -8);
        if (((int)uVar28 < 0) &&
           ((SUB84((__return_storage_ptr__->m_tokens).
                   super_vector<libtorrent::detail::bdecode_token,_std::allocator<libtorrent::detail::bdecode_token>_>
                   .
                   super__Vector_base<libtorrent::detail::bdecode_token,_std::allocator<libtorrent::detail::bdecode_token>_>
                   ._M_impl.super__Vector_impl_data._M_start[uVar28 & 0x7fffffff],0) & 0xe0000000)
            == 0x20000000)) {
          local_60 = (bdecode_token)(uVar15 | 0x220000000);
          *(undefined8 *)((long)&uStack_90 + lVar5) = 0x18f478;
          std::
          vector<libtorrent::detail::bdecode_token,_std::allocator<libtorrent::detail::bdecode_token>_>
          ::emplace_back<libtorrent::detail::bdecode_token>
                    ((vector<libtorrent::detail::bdecode_token,_std::allocator<libtorrent::detail::bdecode_token>_>
                      *)__return_storage_ptr__,&local_60);
          local_60 = (bdecode_token)(uVar15 + 0xa0000000);
          *(undefined8 *)((long)&uStack_90 + lVar5) = 0x18f487;
          std::
          vector<libtorrent::detail::bdecode_token,_std::allocator<libtorrent::detail::bdecode_token>_>
          ::emplace_back<libtorrent::detail::bdecode_token>
                    ((vector<libtorrent::detail::bdecode_token,_std::allocator<libtorrent::detail::bdecode_token>_>
                      *)__return_storage_ptr__,&local_60);
          pvVar23 = local_48;
        }
        uVar28 = *(uint *)((long)pvVar23 + lVar29 * 4 + -8);
        pbVar3 = (__return_storage_ptr__->m_tokens).
                 super_vector<libtorrent::detail::bdecode_token,_std::allocator<libtorrent::detail::bdecode_token>_>
                 .
                 super__Vector_base<libtorrent::detail::bdecode_token,_std::allocator<libtorrent::detail::bdecode_token>_>
                 ._M_impl.super__Vector_impl_data._M_start;
        uVar14 = uVar28 & 0x7fffffff;
        pbVar3[uVar14] =
             (bdecode_token)
             ((ulong)pbVar3[uVar14] & 0xe0000000ffffffff |
             (ulong)(((uint)(*(int *)&(__return_storage_ptr__->m_tokens).
                                      super_vector<libtorrent::detail::bdecode_token,_std::allocator<libtorrent::detail::bdecode_token>_>
                                      .
                                      super__Vector_base<libtorrent::detail::bdecode_token,_std::allocator<libtorrent::detail::bdecode_token>_>
                                      ._M_impl.super__Vector_impl_data._M_finish - (int)pbVar3) >> 3
                     ) - uVar28 & 0x1fffffff) << 0x20);
        local_60 = local_88;
        *(undefined8 *)((long)&uStack_90 + lVar5) = 0x18f4d7;
        std::
        vector<libtorrent::detail::bdecode_token,_std::allocator<libtorrent::detail::bdecode_token>_>
        ::emplace_back<libtorrent::detail::bdecode_token>
                  ((vector<libtorrent::detail::bdecode_token,_std::allocator<libtorrent::detail::bdecode_token>_>
                    *)__return_storage_ptr__,&local_60);
        lVar29 = lVar29 + -1;
        pvVar23 = local_48;
      } while (1 < lVar29);
    }
    plVar24 = local_78;
    uVar28 = (int)local_40 - (int)local_78;
    local_60 = (bdecode_token)((ulong)(uVar28 & 0x1fffffff) + 0xa0000000);
    *(undefined8 *)((long)&uStack_90 + lVar5) = 0x18f51d;
    std::
    vector<libtorrent::detail::bdecode_token,_std::allocator<libtorrent::detail::bdecode_token>_>::
    emplace_back<libtorrent::detail::bdecode_token>
              ((vector<libtorrent::detail::bdecode_token,_std::allocator<libtorrent::detail::bdecode_token>_>
                *)__return_storage_ptr__,&local_60);
    __return_storage_ptr__->m_token_idx = 0;
    __return_storage_ptr__->m_buffer = (char *)plVar24;
    __return_storage_ptr__->m_buffer_size = uVar28;
    __return_storage_ptr__->m_root_tokens =
         (__return_storage_ptr__->m_tokens).
         super_vector<libtorrent::detail::bdecode_token,_std::allocator<libtorrent::detail::bdecode_token>_>
         .
         super__Vector_base<libtorrent::detail::bdecode_token,_std::allocator<libtorrent::detail::bdecode_token>_>
         ._M_impl.super__Vector_impl_data._M_start;
  }
  else {
    if (ec != (error_code *)0x0) {
      ec->val_ = 0;
    }
    uVar15 = 0x100000006;
    if ((bdecode_category::bdecode_category.super_error_category.id_ != 0x8fafd21e25c5e09b) &&
       (uVar15 = 0x100000006,
       bdecode_category::bdecode_category.super_error_category.id_ != 0xb2ab117a257edf0d)) {
      uStack_90 = 0x18e456;
      iVar10 = (*bdecode_category::bdecode_category.super_error_category._vptr_error_category[6])
                         (&bdecode_category::bdecode_category,6);
      uVar15 = 6;
      if ((char)iVar10 != '\0') {
        uVar15 = 0x100000006;
      }
    }
    *puVar18 = uVar15;
    puVar18[1] = (ulong)&bdecode_category::bdecode_category;
  }
  return __return_storage_ptr__;
}

Assistant:

bdecode_node bdecode(span<char const> buffer
		, error_code& ec, int* error_pos, int depth_limit, int token_limit)
	{
		bdecode_node ret;
		ec.clear();

		if (buffer.size() > bdecode_token::max_offset)
		{
			if (error_pos) *error_pos = 0;
			ec = bdecode_errors::limit_exceeded;
			return ret;
		}

		// this is the stack of bdecode_token indices, into m_tokens.
		// sp is the stack pointer, as index into the array, stack
		int sp = 0;
		TORRENT_ALLOCA(stack, stack_frame, depth_limit);

		// TODO: 2 attempt to simplify this implementation by embracing the span
		char const* start = buffer.data();
		char const* end = start + buffer.size();
		char const* const orig_start = start;

		if (start == end)
			TORRENT_FAIL_BDECODE(bdecode_errors::unexpected_eof);

		while (start <= end)
		{
			if (start >= end) TORRENT_FAIL_BDECODE(bdecode_errors::unexpected_eof);

			if (sp >= depth_limit)
				TORRENT_FAIL_BDECODE(bdecode_errors::depth_exceeded);

			--token_limit;
			if (token_limit < 0)
				TORRENT_FAIL_BDECODE(bdecode_errors::limit_exceeded);

			// look for a new token
			char const t = *start;

			int const current_frame = sp;

			// if we're currently parsing a dictionary, assert that
			// every other node is a string.
			if (current_frame > 0
				&& ret.m_tokens[stack[current_frame - 1].token].type == bdecode_token::dict)
			{
				if (stack[current_frame - 1].state == 0)
				{
					// the current parent is a dict and we are parsing a key.
					// only allow a digit (for a string) or 'e' to terminate
					if (!numeric(t) && t != 'e')
						TORRENT_FAIL_BDECODE(bdecode_errors::expected_digit);
				}
			}

			switch (t)
			{
				case 'd':
					stack[sp++] = stack_frame(int(ret.m_tokens.size()));
					// we push it into the stack so that we know where to fill
					// in the next_node field once we pop this node off the stack.
					// i.e. get to the node following the dictionary in the buffer
					ret.m_tokens.push_back({start - orig_start, bdecode_token::dict});
					++start;
					break;
				case 'l':
					stack[sp++] = stack_frame(int(ret.m_tokens.size()));
					// we push it into the stack so that we know where to fill
					// in the next_node field once we pop this node off the stack.
					// i.e. get to the node following the list in the buffer
					ret.m_tokens.push_back({start - orig_start, bdecode_token::list});
					++start;
					break;
				case 'i':
				{
					char const* const int_start = start;
					bdecode_errors::error_code_enum e = bdecode_errors::no_error;
					// +1 here to point to the first digit, rather than 'i'
					start = check_integer(start + 1, end, e);
					if (e)
					{
						// in order to gracefully terminate the tree,
						// make sure the end of the previous token is set correctly
						if (error_pos) *error_pos = int(start - orig_start);
						error_pos = nullptr;
						start = int_start;
						TORRENT_FAIL_BDECODE(e);
					}
					ret.m_tokens.push_back({int_start - orig_start
						, 1, bdecode_token::integer, 1});
					TORRENT_ASSERT(*start == 'e');

					// skip 'e'
					++start;
					break;
				}
				case 'e':
				{
					// this is the end of a list or dict
					if (sp == 0)
						TORRENT_FAIL_BDECODE(bdecode_errors::unexpected_eof);

					if (sp > 0
						&& ret.m_tokens[stack[sp - 1].token].type == bdecode_token::dict
						&& stack[sp - 1].state == 1)
					{
						// this means we're parsing a dictionary and about to parse a
						// value associated with a key. Instead, we got a termination
						TORRENT_FAIL_BDECODE(bdecode_errors::expected_value);
					}

					// insert the end-of-sequence token
					ret.m_tokens.push_back({start - orig_start, 1, bdecode_token::end});

					// and back-patch the start of this sequence with the offset
					// to the next token we'll insert
					int const top = stack[sp - 1].token;
					// subtract the token's own index, since this is a relative
					// offset
					if (int(ret.m_tokens.size()) - top > bdecode_token::max_next_item)
						TORRENT_FAIL_BDECODE(bdecode_errors::limit_exceeded);

					ret.m_tokens[std::size_t(top)].next_item = std::uint32_t(int(ret.m_tokens.size()) - top);

					// and pop it from the stack.
					TORRENT_ASSERT(sp > 0);
					--sp;
					++start;
					break;
				}
				default:
				{
					// this is the case for strings. The start character is any
					// numeric digit
					if (!numeric(t))
						TORRENT_FAIL_BDECODE(bdecode_errors::expected_value);

					std::int64_t len = t - '0';
					char const* const str_start = start;
					++start;
					if (start >= end) TORRENT_FAIL_BDECODE(bdecode_errors::unexpected_eof);
					bdecode_errors::error_code_enum e = bdecode_errors::no_error;
					start = parse_int(start, end, ':', len, e);
					if (e)
						TORRENT_FAIL_BDECODE(e);
					if (start == end)
						TORRENT_FAIL_BDECODE(bdecode_errors::expected_colon);

					// remaining buffer size excluding ':'
					ptrdiff_t const buff_size = end - start - 1;
					if (len > buff_size)
						TORRENT_FAIL_BDECODE(bdecode_errors::unexpected_eof);
					if (len < 0)
						TORRENT_FAIL_BDECODE(bdecode_errors::overflow);

					// skip ':'
					++start;
					// no need to range check start here
					// the check above ensures that the buffer is long enough to hold
					// the string's length which guarantees that start <= end

					// the bdecode_token only has 8 bits to keep the header size
					// in. If it overflows, fail!
					if (start - str_start - 2 > detail::bdecode_token::max_header)
						TORRENT_FAIL_BDECODE(bdecode_errors::limit_exceeded);

					ret.m_tokens.push_back({str_start - orig_start
						, 1, bdecode_token::string, std::uint8_t(start - str_start)});
					start += len;
					break;
				}
			}

			if (current_frame > 0
				&& ret.m_tokens[stack[current_frame - 1].token].type == bdecode_token::dict)
			{
				// the next item we parse is the opposite
				// state is an unsigned 1-bit member. adding 1 will flip the bit
				stack[current_frame - 1].state = (stack[current_frame - 1].state + 1) & 1;
			}

			// this terminates the top level node, we're done!
			if (sp == 0) break;
		}

done:

		// if parse failed, sp will be greater than 1
		// unwind the stack by inserting terminator to make whatever we have
		// so far valid
		while (sp > 0) {
			TORRENT_ASSERT(ec);
			--sp;

			// we may need to insert a dummy token to properly terminate the tree,
			// in case we just parsed a key to a dict and failed in the value
			if (ret.m_tokens[stack[sp].token].type == bdecode_token::dict
				&& stack[sp].state == 1)
			{
				// insert an empty dictionary as the value
				ret.m_tokens.push_back({start - orig_start, 2, bdecode_token::dict});
				ret.m_tokens.push_back({start - orig_start, bdecode_token::end});
			}

			int const top = stack[sp].token;
			TORRENT_ASSERT(int(ret.m_tokens.size()) - top <= bdecode_token::max_next_item);
			ret.m_tokens[std::size_t(top)].next_item = std::uint32_t(int(ret.m_tokens.size()) - top);
			ret.m_tokens.push_back({start - orig_start, 1, bdecode_token::end});
		}

		ret.m_tokens.push_back({start - orig_start, 0, bdecode_token::end});

		ret.m_token_idx = 0;
		ret.m_buffer = orig_start;
		ret.m_buffer_size = int(start - orig_start);
		ret.m_root_tokens = ret.m_tokens.data();

		return ret;
	}